

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O3

int run_test_pipe_server_close(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *loop;
  bool bVar2;
  uv_loop_t *unaff_RBX;
  uv_connect_t *puVar3;
  uv_pipe_t *puVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_50 [24];
  uv_loop_t *puStack_38;
  uv__queue *puStack_28;
  code *pcStack_20;
  long local_18;
  long local_10;
  
  pcStack_20 = (code *)0x1af81a;
  loop = uv_default_loop();
  if (loop == (uv_loop_t *)0x0) {
    pcStack_20 = (code *)0x1af9c6;
    run_test_pipe_server_close_cold_9();
LAB_001af9c6:
    pcStack_20 = (code *)0x1af9d3;
    run_test_pipe_server_close_cold_1();
LAB_001af9d3:
    pcStack_20 = (code *)0x1af9e0;
    run_test_pipe_server_close_cold_2();
LAB_001af9e0:
    pcStack_20 = (code *)0x1af9ed;
    run_test_pipe_server_close_cold_3();
LAB_001af9ed:
    pcStack_20 = (code *)0x1af9fa;
    run_test_pipe_server_close_cold_4();
LAB_001af9fa:
    pcStack_20 = (code *)0x1afa07;
    run_test_pipe_server_close_cold_5();
LAB_001afa07:
    pcStack_20 = (code *)0x1afa14;
    run_test_pipe_server_close_cold_6();
  }
  else {
    pcStack_20 = (code *)0x1af837;
    iVar1 = uv_pipe_init(loop,&pipe_server,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    unaff_RBX = loop;
    if (local_10 != 0) goto LAB_001af9c6;
    pcStack_20 = (code *)0x1af868;
    iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001af9d3;
    pcStack_20 = (code *)0x1af89b;
    iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001af9e0;
    pcStack_20 = (code *)0x1af8ca;
    iVar1 = uv_pipe_init(loop,&pipe_client,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001af9ed;
    pcStack_20 = (code *)0x1af909;
    uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
    pcStack_20 = (code *)0x1af913;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001af9fa;
    local_10 = 1;
    local_18 = (long)pipe_client_connect_cb_called;
    if (local_18 != 1) goto LAB_001afa07;
    local_10 = 2;
    local_18 = (long)pipe_close_cb_called;
    if (local_18 == 2) {
      pcStack_20 = (code *)0x1af988;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_20 = (code *)0x1af992;
      uv_run(loop,UV_RUN_DEFAULT);
      local_10 = 0;
      pcStack_20 = (code *)0x1af9a3;
      iVar1 = uv_loop_close(loop);
      local_18 = (long)iVar1;
      if (local_10 == local_18) {
        pcStack_20 = (code *)0x1af9b9;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001afa21;
    }
  }
  pcStack_20 = (code *)0x1afa21;
  run_test_pipe_server_close_cold_7();
LAB_001afa21:
  iVar1 = (int)auStack_50 + 0x38;
  pcStack_20 = pipe_server_connection_cb;
  run_test_pipe_server_close_cold_8();
  pcStack_20 = (code *)(long)iVar1;
  puStack_28 = (uv__queue *)0x0;
  if ((uv_handle_t *)pcStack_20 == (uv_handle_t *)0x0) {
    return iVar1;
  }
  puVar3 = (uv_connect_t *)(auStack_50 + 0x30);
  iVar1 = (int)auStack_50 + 0x28;
  puStack_38 = (uv_loop_t *)pipe_client_connect_cb;
  pipe_server_connection_cb_cold_1();
  puStack_38 = unaff_RBX;
  if (puVar3 == &connect_req) {
    auStack_50._16_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if (auStack_50._16_8_ == 0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      auStack_50._0_8_ = (void *)0x1afaab;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return extraout_EAX;
    }
  }
  else {
    auStack_50._0_8_ = (void *)0x1afac4;
    pipe_client_connect_cb_cold_1();
  }
  puVar4 = (uv_pipe_t *)(auStack_50 + 0x10);
  auStack_50._0_8_ = pipe_close_cb;
  pipe_client_connect_cb_cold_2();
  bVar2 = puVar4 == &pipe_server || puVar4 == &pipe_client;
  auStack_50._0_8_ = ZEXT18(bVar2);
  if ((void *)auStack_50._0_8_ != (void *)0x0) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)bVar2;
  }
  handle = (uv_handle_t *)auStack_50;
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(pipe_server_close) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_NOT_NULL(loop);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT_OK(r);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT_OK(r);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, pipe_client_connect_cb_called);
  ASSERT_EQ(2, pipe_close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}